

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_invert(matrix4 *self)

{
  matrix4 *pmVar1;
  byte local_91;
  undefined1 local_90 [7];
  uint8_t i;
  matrix4 inverse;
  matrix4 *self_local;
  
  inverse.field_0.m[0xf] = (double)self;
  pmVar1 = matrix4_inverse(self,(matrix4 *)local_90);
  if (pmVar1 != (matrix4 *)0x0) {
    for (local_91 = 0; local_91 < 0x10; local_91 = local_91 + 1) {
      *(undefined8 *)((long)inverse.field_0.m[0xf] + (ulong)local_91 * 8) =
           *(undefined8 *)(local_90 + (ulong)local_91 * 8);
    }
  }
  return (matrix4 *)inverse.field_0.m[0xf];
}

Assistant:

HYPAPI struct matrix4 *matrix4_invert(struct matrix4 *self)
{
	struct matrix4 inverse;
	uint8_t i;

	if (matrix4_inverse(self, &inverse)) {
		for (i = 0; i < 16; i++) {
			self->m[i] = inverse.m[i];
		}
	}

	return self;
}